

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.c++
# Opt level: O0

void __thiscall kj::_::BTreeImpl::erase(BTreeImpl *this,uint row,SearchKey *searchKey)

{
  bool bVar1;
  Parent *pPVar2;
  ulong uVar3;
  size_t sVar4;
  Leaf *this_00;
  Fault local_188;
  Fault f_3;
  undefined1 local_178 [8];
  DebugComparison<kj::_::BTreeImpl::MaybeUint_&,_unsigned_int_&> _kjCondition_3;
  Fault f_2;
  uint *local_140;
  undefined1 local_138 [8];
  DebugComparison<unsigned_int_&,_int> _kjCondition_2;
  Fault f_1;
  MaybeUint *local_100;
  undefined1 local_f8 [8];
  DebugComparison<kj::_::BTreeImpl::MaybeUint_&,_std::nullptr_t> _kjCondition_1;
  uint r;
  Leaf *leaf;
  Fault local_b0;
  Fault f;
  MaybeUint **local_a0;
  undefined1 local_98 [8];
  DebugComparison<kj::_::BTreeImpl::MaybeUint_*&,_std::nullptr_t> _kjCondition;
  MaybeUint *newFixup;
  Parent *node;
  Iterator local_58;
  uint i;
  Iterator __end2;
  Iterator __begin2;
  Range<unsigned_int> *__range2;
  MaybeUint *fixup;
  Parent *pPStack_30;
  uint indexInParent;
  Parent *parent;
  SearchKey *pSStack_20;
  uint pos;
  SearchKey *searchKey_local;
  BTreeImpl *pBStack_10;
  uint row_local;
  BTreeImpl *this_local;
  
  parent._4_4_ = 0;
  pPStack_30 = (Parent *)0x0;
  fixup._4_4_ = 0;
  __range2 = (Range<unsigned_int> *)0x0;
  pSStack_20 = searchKey;
  searchKey_local._4_4_ = row;
  pBStack_10 = this;
  ___end2 = zeroTo<unsigned_int>(this->height);
  i = (uint)Range<unsigned_int>::begin((Range<unsigned_int> *)&__end2);
  local_58 = Range<unsigned_int>::end((Range<unsigned_int> *)&__end2);
  while (bVar1 = Range<unsigned_int>::Iterator::operator==((Iterator *)&i,&local_58),
        ((bVar1 ^ 0xffU) & 1) != 0) {
    Range<unsigned_int>::Iterator::operator*((Iterator *)&i);
    pPVar2 = eraseHelper<kj::_::BTreeImpl::Parent>
                       (this,(Parent *)(this->tree + parent._4_4_),pPStack_30,fixup._4_4_,
                        parent._4_4_,(MaybeUint **)&__range2);
    pPStack_30 = pPVar2;
    fixup._4_4_ = (**pSStack_20->_vptr_SearchKey)(pSStack_20,pPVar2);
    parent._4_4_ = pPVar2->children[fixup._4_4_];
    uVar3 = (ulong)fixup._4_4_;
    sVar4 = size<kj::_::BTreeImpl::MaybeUint,7ul>(&pPVar2->keys);
    if (((uVar3 < sVar4) &&
        (bVar1 = MaybeUint::operator==(pPVar2->keys + fixup._4_4_,searchKey_local._4_4_), bVar1)) &&
       (_kjCondition._32_8_ = pPVar2->keys + fixup._4_4_,
       __range2 != (Range<unsigned_int> *)_kjCondition._32_8_)) {
      local_a0 = (MaybeUint **)
                 DebugExpressionStart::operator<<
                           ((DebugExpressionStart *)&_::MAGIC_ASSERT,(MaybeUint **)&__range2);
      f.exception = (Exception *)0x0;
      DebugExpression<kj::_::BTreeImpl::MaybeUint*&>::operator==
                ((DebugComparison<kj::_::BTreeImpl::MaybeUint_*&,_std::nullptr_t> *)local_98,
                 (DebugExpression<kj::_::BTreeImpl::MaybeUint*&> *)&local_a0,&f.exception);
      bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
      if (!bVar1) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::BTreeImpl::MaybeUint*&,decltype(nullptr)>&>
                  (&local_b0,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0x1dd,FAILED,"fixup == nullptr","_kjCondition,",
                   (DebugComparison<kj::_::BTreeImpl::MaybeUint_*&,_std::nullptr_t> *)local_98);
        Debug::Fault::fatal(&local_b0);
      }
      __range2 = (Range<unsigned_int> *)_kjCondition._32_8_;
    }
    Range<unsigned_int>::Iterator::operator++((Iterator *)&i);
  }
  this_00 = eraseHelper<kj::_::BTreeImpl::Leaf>
                      (this,(Leaf *)(this->tree + parent._4_4_),pPStack_30,fixup._4_4_,parent._4_4_,
                       (MaybeUint **)&__range2);
  _kjCondition_1._36_4_ = (*pSStack_20->_vptr_SearchKey[1])(pSStack_20,this_00);
  bVar1 = MaybeUint::operator==(this_00->rows + (uint)_kjCondition_1._36_4_,searchKey_local._4_4_);
  if (bVar1) {
    Leaf::erase(this_00,_kjCondition_1._36_4_);
    if (__range2 != (Range<unsigned_int> *)0x0) {
      local_100 = (MaybeUint *)
                  DebugExpressionStart::operator<<
                            ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                             this_00->rows + (uint)_kjCondition_1._36_4_);
      f_1.exception = (Exception *)0x0;
      DebugExpression<kj::_::BTreeImpl::MaybeUint&>::operator==
                ((DebugComparison<kj::_::BTreeImpl::MaybeUint_&,_std::nullptr_t> *)local_f8,
                 (DebugExpression<kj::_::BTreeImpl::MaybeUint&> *)&local_100,&f_1.exception);
      bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_f8);
      if (!bVar1) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::BTreeImpl::MaybeUint&,decltype(nullptr)>&>
                  ((Fault *)&_kjCondition_2.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0x1ec,FAILED,"leaf.rows[r] == nullptr","_kjCondition,",
                   (DebugComparison<kj::_::BTreeImpl::MaybeUint_&,_std::nullptr_t> *)local_f8);
        Debug::Fault::fatal((Fault *)&_kjCondition_2.result);
      }
      local_140 = (uint *)DebugExpressionStart::operator<<
                                    ((DebugExpressionStart *)&_::MAGIC_ASSERT,
                                     (uint *)&_kjCondition_1.field_0x24);
      f_2.exception._4_4_ = 0;
      DebugExpression<unsigned_int&>::operator>
                ((DebugComparison<unsigned_int_&,_int> *)local_138,
                 (DebugExpression<unsigned_int&> *)&local_140,(int *)((long)&f_2.exception + 4));
      bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_138);
      if (!bVar1) {
        Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,int>&>
                  ((Fault *)&_kjCondition_3.result,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0x1ed,FAILED,"r > 0","_kjCondition,",
                   (DebugComparison<unsigned_int_&,_int> *)local_138);
        Debug::Fault::fatal((Fault *)&_kjCondition_3.result);
      }
      f_3.exception =
           (Exception *)
           DebugExpressionStart::operator<<
                     ((DebugExpressionStart *)&_::MAGIC_ASSERT,(MaybeUint *)__range2);
      DebugExpression<kj::_::BTreeImpl::MaybeUint&>::operator==
                ((DebugComparison<kj::_::BTreeImpl::MaybeUint_&,_unsigned_int_&> *)local_178,
                 (DebugExpression<kj::_::BTreeImpl::MaybeUint&> *)&f_3,
                 (uint *)((long)&searchKey_local + 4));
      bVar1 = DebugComparison::operator_cast_to_bool((DebugComparison *)local_178);
      if (!bVar1) {
        Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<kj::_::BTreeImpl::MaybeUint&,unsigned_int&>&>
                  (&local_188,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/table.c++"
                   ,0x1ee,FAILED,"*fixup == row","_kjCondition,",
                   (DebugComparison<kj::_::BTreeImpl::MaybeUint_&,_unsigned_int_&> *)local_178);
        Debug::Fault::fatal(&local_188);
      }
      __range2->begin_ = this_00->rows[_kjCondition_1._36_4_ - 1].i;
    }
  }
  else {
    logInconsistency(this);
  }
  return;
}

Assistant:

void BTreeImpl::erase(uint row, const SearchKey& searchKey) {
  // Erase the given row number from the tree. predicate() returns true for the given row and all
  // rows after it.

  uint pos = 0;

  // Track grandparent node and child index within grandparent.
  Parent* parent = nullptr;
  uint indexInParent = 0;

  MaybeUint* fixup = nullptr;

  for (auto i KJ_UNUSED: zeroTo(height)) {
    Parent& node = eraseHelper(tree[pos].parent, parent, indexInParent, pos, fixup);

    parent = &node;
    indexInParent = searchKey.search(node);
    pos = node.children[indexInParent];

    if (indexInParent < kj::size(node.keys) && node.keys[indexInParent] == row) {
      // Oh look, the row is a key in this node! We'll need to come back and fix this up later.
      // Note that any particular row can only appear as *one* key value anywhere in the tree, so
      // we only need one fixup pointer, which is nice.
      MaybeUint* newFixup = &node.keys[indexInParent];
      if (fixup == newFixup) {
        // The fixup pointer was already set while processing a parent node, and then a merge or
        // rotate caused it to be moved, but the fixup pointer was updated... so it's already set
        // to point at the slot we wanted it to point to, so nothing to see here.
      } else {
        KJ_DASSERT(fixup == nullptr);
        fixup = newFixup;
      }
    }
  }

  Leaf& leaf = eraseHelper(tree[pos].leaf, parent, indexInParent, pos, fixup);

  uint r = searchKey.search(leaf);
  if (leaf.rows[r] == row) {
    leaf.erase(r);

    if (fixup != nullptr) {
      // There's a key in a parent node that needs fixup. This is only possible if the removed
      // node is the last in its leaf.
      KJ_DASSERT(leaf.rows[r] == nullptr);
      KJ_DASSERT(r > 0);  // non-root nodes must be at least half full so this can't be item 0
      KJ_DASSERT(*fixup == row);
      *fixup = leaf.rows[r - 1];
    }
  } else {
    logInconsistency();
  }
}